

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

Statistics * __thiscall duckdb_parquet::Statistics::operator=(Statistics *this,Statistics *other15)

{
  int64_t iVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->max);
  std::__cxx11::string::_M_assign((string *)&this->min);
  iVar1 = other15->distinct_count;
  this->null_count = other15->null_count;
  this->distinct_count = iVar1;
  std::__cxx11::string::_M_assign((string *)&this->max_value);
  std::__cxx11::string::_M_assign((string *)&this->min_value);
  this->is_max_value_exact = other15->is_max_value_exact;
  this->is_min_value_exact = other15->is_min_value_exact;
  this->__isset = other15->__isset;
  return this;
}

Assistant:

Statistics& Statistics::operator=(const Statistics& other15) {
  max = other15.max;
  min = other15.min;
  null_count = other15.null_count;
  distinct_count = other15.distinct_count;
  max_value = other15.max_value;
  min_value = other15.min_value;
  is_max_value_exact = other15.is_max_value_exact;
  is_min_value_exact = other15.is_min_value_exact;
  __isset = other15.__isset;
  return *this;
}